

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockingPriorityQueue.hpp
# Opt level: O0

optional<std::pair<helics::route_id,_helics::ActionMessage>_> * __thiscall
gmlc::containers::
BlockingPriorityQueue<std::pair<helics::route_id,helics::ActionMessage>,std::mutex,std::condition_variable>
::pop<std::chrono::duration<long,std::ratio<1l,1000l>>>
          (BlockingPriorityQueue<std::pair<helics::route_id,_helics::ActionMessage>,_std::mutex,_std::condition_variable>
           *this,duration<long,_std::ratio<1L,_1000L>_> timeout)

{
  bool bVar1;
  undefined1 uVar2;
  cv_status cVar3;
  unique_lock<std::mutex> *in_RSI;
  optional<std::pair<helics::route_id,_helics::ActionMessage>_> *in_RDI;
  cv_status res;
  unique_lock<std::mutex> pullLock;
  optional<std::pair<helics::route_id,_helics::ActionMessage>_> *val;
  reference in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffec0;
  cv_status in_stack_fffffffffffffec4;
  reference in_stack_fffffffffffffec8;
  undefined7 in_stack_fffffffffffffed0;
  condition_variable *in_stack_fffffffffffffef0;
  BlockingPriorityQueue<std::pair<helics::route_id,_helics::ActionMessage>,_std::mutex,_std::condition_variable>
  *in_stack_fffffffffffffef8;
  int local_40;
  
  BlockingPriorityQueue<std::pair<helics::route_id,_helics::ActionMessage>,_std::mutex,_std::condition_variable>
  ::try_pop(in_stack_fffffffffffffef8);
  do {
    bVar1 = std::optional::operator_cast_to_bool
                      ((optional<std::pair<helics::route_id,_helics::ActionMessage>_> *)0x3ddd10);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      return in_RDI;
    }
    std::unique_lock<std::mutex>::unique_lock
              ((unique_lock<std::mutex> *)
               CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
               (mutex_type *)in_stack_fffffffffffffeb8);
    uVar2 = std::
            queue<std::pair<helics::route_id,_helics::ActionMessage>,_std::deque<std::pair<helics::route_id,_helics::ActionMessage>,_std::allocator<std::pair<helics::route_id,_helics::ActionMessage>_>_>_>
            ::empty((queue<std::pair<helics::route_id,_helics::ActionMessage>,_std::deque<std::pair<helics::route_id,_helics::ActionMessage>,_std::allocator<std::pair<helics::route_id,_helics::ActionMessage>_>_>_>
                     *)0x3ddd44);
    if ((bool)uVar2) {
      bVar1 = std::
              vector<std::pair<helics::route_id,_helics::ActionMessage>,_std::allocator<std::pair<helics::route_id,_helics::ActionMessage>_>_>
              ::empty((vector<std::pair<helics::route_id,_helics::ActionMessage>,_std::allocator<std::pair<helics::route_id,_helics::ActionMessage>_>_>
                       *)CONCAT17(uVar2,in_stack_fffffffffffffed0));
      if (bVar1) {
        cVar3 = std::condition_variable::wait_for<long,std::ratio<1l,1000l>>
                          (in_stack_fffffffffffffef0,in_RSI,
                           (duration<long,_std::ratio<1L,_1000L>_> *)in_RDI);
        in_stack_fffffffffffffec4 = cVar3;
        bVar1 = std::
                queue<std::pair<helics::route_id,_helics::ActionMessage>,_std::deque<std::pair<helics::route_id,_helics::ActionMessage>,_std::allocator<std::pair<helics::route_id,_helics::ActionMessage>_>_>_>
                ::empty((queue<std::pair<helics::route_id,_helics::ActionMessage>,_std::deque<std::pair<helics::route_id,_helics::ActionMessage>,_std::allocator<std::pair<helics::route_id,_helics::ActionMessage>_>_>_>
                         *)0x3dde6f);
        in_stack_fffffffffffffec0 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffec0);
        if (bVar1) {
          bVar1 = std::
                  vector<std::pair<helics::route_id,_helics::ActionMessage>,_std::allocator<std::pair<helics::route_id,_helics::ActionMessage>_>_>
                  ::empty((vector<std::pair<helics::route_id,_helics::ActionMessage>,_std::allocator<std::pair<helics::route_id,_helics::ActionMessage>_>_>
                           *)CONCAT17(uVar2,in_stack_fffffffffffffed0));
          if (bVar1) {
            std::unique_lock<std::mutex>::unlock
                      ((unique_lock<std::mutex> *)
                       CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
            BlockingPriorityQueue<std::pair<helics::route_id,_helics::ActionMessage>,_std::mutex,_std::condition_variable>
            ::try_pop(in_stack_fffffffffffffef8);
            std::optional<std::pair<helics::route_id,_helics::ActionMessage>_>::operator=
                      ((optional<std::pair<helics::route_id,_helics::ActionMessage>_> *)
                       CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                       (optional<std::pair<helics::route_id,_helics::ActionMessage>_> *)
                       in_stack_fffffffffffffeb8);
            std::optional<std::pair<helics::route_id,_helics::ActionMessage>_>::~optional
                      ((optional<std::pair<helics::route_id,_helics::ActionMessage>_> *)0x3ddf48);
            if (cVar3 == no_timeout) {
              local_40 = 0;
            }
            else {
              local_40 = 3;
            }
          }
          else {
            std::
            vector<std::pair<helics::route_id,_helics::ActionMessage>,_std::allocator<std::pair<helics::route_id,_helics::ActionMessage>_>_>
            ::back((vector<std::pair<helics::route_id,_helics::ActionMessage>,_std::allocator<std::pair<helics::route_id,_helics::ActionMessage>_>_>
                    *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
            std::optional<std::pair<helics::route_id,helics::ActionMessage>>::operator=
                      ((optional<std::pair<helics::route_id,_helics::ActionMessage>_> *)
                       CONCAT17(uVar2,in_stack_fffffffffffffed0),in_stack_fffffffffffffec8);
            std::
            vector<std::pair<helics::route_id,_helics::ActionMessage>,_std::allocator<std::pair<helics::route_id,_helics::ActionMessage>_>_>
            ::pop_back((vector<std::pair<helics::route_id,_helics::ActionMessage>,_std::allocator<std::pair<helics::route_id,_helics::ActionMessage>_>_>
                        *)0x3ddf02);
            local_40 = 3;
          }
        }
        else {
          in_stack_fffffffffffffeb8 =
               std::
               queue<std::pair<helics::route_id,_helics::ActionMessage>,_std::deque<std::pair<helics::route_id,_helics::ActionMessage>,_std::allocator<std::pair<helics::route_id,_helics::ActionMessage>_>_>_>
               ::front((queue<std::pair<helics::route_id,_helics::ActionMessage>,_std::deque<std::pair<helics::route_id,_helics::ActionMessage>,_std::allocator<std::pair<helics::route_id,_helics::ActionMessage>_>_>_>
                        *)0x3dde90);
          std::optional<std::pair<helics::route_id,helics::ActionMessage>>::operator=
                    ((optional<std::pair<helics::route_id,_helics::ActionMessage>_> *)
                     CONCAT17(uVar2,in_stack_fffffffffffffed0),in_stack_fffffffffffffec8);
          std::
          queue<std::pair<helics::route_id,_helics::ActionMessage>,_std::deque<std::pair<helics::route_id,_helics::ActionMessage>,_std::allocator<std::pair<helics::route_id,_helics::ActionMessage>_>_>_>
          ::pop((queue<std::pair<helics::route_id,_helics::ActionMessage>,_std::deque<std::pair<helics::route_id,_helics::ActionMessage>,_std::allocator<std::pair<helics::route_id,_helics::ActionMessage>_>_>_>
                 *)0x3ddeb5);
          local_40 = 3;
        }
      }
      else {
        std::
        vector<std::pair<helics::route_id,_helics::ActionMessage>,_std::allocator<std::pair<helics::route_id,_helics::ActionMessage>_>_>
        ::back((vector<std::pair<helics::route_id,_helics::ActionMessage>,_std::allocator<std::pair<helics::route_id,_helics::ActionMessage>_>_>
                *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
        std::optional<std::pair<helics::route_id,helics::ActionMessage>>::operator=
                  ((optional<std::pair<helics::route_id,_helics::ActionMessage>_> *)
                   CONCAT17(uVar2,in_stack_fffffffffffffed0),in_stack_fffffffffffffec8);
        std::
        vector<std::pair<helics::route_id,_helics::ActionMessage>,_std::allocator<std::pair<helics::route_id,_helics::ActionMessage>_>_>
        ::pop_back((vector<std::pair<helics::route_id,_helics::ActionMessage>,_std::allocator<std::pair<helics::route_id,_helics::ActionMessage>_>_>
                    *)0x3dde1c);
        local_40 = 3;
      }
    }
    else {
      in_stack_fffffffffffffec8 =
           std::
           queue<std::pair<helics::route_id,_helics::ActionMessage>,_std::deque<std::pair<helics::route_id,_helics::ActionMessage>,_std::allocator<std::pair<helics::route_id,_helics::ActionMessage>_>_>_>
           ::front((queue<std::pair<helics::route_id,_helics::ActionMessage>,_std::deque<std::pair<helics::route_id,_helics::ActionMessage>,_std::allocator<std::pair<helics::route_id,_helics::ActionMessage>_>_>_>
                    *)0x3ddd69);
      std::optional<std::pair<helics::route_id,helics::ActionMessage>>::operator=
                ((optional<std::pair<helics::route_id,_helics::ActionMessage>_> *)
                 CONCAT17(uVar2,in_stack_fffffffffffffed0),in_stack_fffffffffffffec8);
      std::
      queue<std::pair<helics::route_id,_helics::ActionMessage>,_std::deque<std::pair<helics::route_id,_helics::ActionMessage>,_std::allocator<std::pair<helics::route_id,_helics::ActionMessage>_>_>_>
      ::pop((queue<std::pair<helics::route_id,_helics::ActionMessage>,_std::deque<std::pair<helics::route_id,_helics::ActionMessage>,_std::allocator<std::pair<helics::route_id,_helics::ActionMessage>_>_>_>
             *)0x3ddd90);
      local_40 = 3;
    }
    std::unique_lock<std::mutex>::~unique_lock
              ((unique_lock<std::mutex> *)
               CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
  } while (local_40 == 0);
  return in_RDI;
}

Assistant:

std::optional<T> pop(TIME timeout)
        {
            auto val = try_pop();
            while (!val) {
                std::unique_lock<MUTEX> pullLock(
                    m_pullLock);  // get the lock then wait
                if (!priorityQueue.empty()) {
                    val = std::move(priorityQueue.front());
                    priorityQueue.pop();
                    break;
                }
                if (!pullElements.empty())  // make sure we are actually empty;
                {
                    val = std::move(pullElements.back());
                    pullElements.pop_back();
                    break;
                }
                auto res = condition.wait_for(pullLock, timeout);  // now wait

                if (!priorityQueue.empty()) {
                    val = std::move(priorityQueue.front());
                    priorityQueue.pop();
                    break;
                }
                if (!pullElements.empty())  // check for spurious wake-ups
                {
                    val = std::move(pullElements.back());
                    pullElements.pop_back();
                    break;
                }
                pullLock.unlock();
                val = try_pop();
                if (res !=
                    std::cv_status::no_timeout)  // std::cv_status::no_timeout
                {
                    break;
                }
            }
            // move the value out of the optional
            return val;
        }